

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O3

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddCallApplyTargetInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          ProfileId callApplyCallSiteId,FunctionInfo *inlinee)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  FunctionBody *this_00;
  Recycler *this_01;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar6;
  FunctionCodeGenJitTimeData *pFVar7;
  Type *addr;
  ulong size;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = recycler;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xd8,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) goto LAB_00434c46;
    *puVar5 = 0;
  }
  this_00 = GetFunctionBody(this);
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xda,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar2) goto LAB_00434c46;
    *puVar5 = 0;
  }
  if (this_00->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdb,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_00434c46;
    *puVar5 = 0;
  }
  uVar3 = FunctionBody::GetCountField(this_00,ProfiledCallApplyCallSiteCount);
  if ((ushort)uVar3 <= callApplyCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdc,
                                "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                ,
                                "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                               );
    if (!bVar2) goto LAB_00434c46;
    *puVar5 = 0;
  }
  if (inlinee == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xdd,"(inlinee != nullptr)","inlinee != nullptr");
    if (!bVar2) goto LAB_00434c46;
    *puVar5 = 0;
  }
  pWVar6 = (this->callApplyTargetInlinees).ptr;
  addr = &this->callApplyTargetInlinees;
  if (pWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    uVar3 = FunctionBody::GetCountField(this_00,ProfiledCallApplyCallSiteCount);
    data.plusSize = (size_t)(uVar3 & 0xffff);
    local_68 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_d5b701;
    data.filename._0_4_ = 0xe1;
    this_01 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_68);
    uVar3 = FunctionBody::GetCountField(this_00,ProfiledCallApplyCallSiteCount);
    if ((uVar3 & 0xffff) == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_01,(TrackAllocData *)0x0);
      pWVar6 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00434c46;
        *puVar5 = 0;
      }
      size = (ulong)((uVar3 & 0xffff) << 3);
      pWVar6 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (this_01,size);
      if (pWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00434c46;
        *puVar5 = 0;
      }
      memset(pWVar6,0,size);
    }
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar6 = addr->ptr;
  }
  if (pWVar6[callApplyCallSiteId].ptr != (FunctionCodeGenJitTimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xe5,"(callApplyTargetInlinees[callApplyCallSiteId] == nullptr)",
                                "callApplyTargetInlinees[callApplyCallSiteId] == nullptr");
    if (!bVar2) {
LAB_00434c46:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pFVar7 = New((Recycler *)data._32_8_,inlinee,(EntryPointInfo *)0x0,true);
  pWVar6 = addr->ptr + callApplyCallSiteId;
  Memory::Recycler::WBSetBit((char *)pWVar6);
  pWVar6->ptr = pFVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar6);
  return pFVar7;
}

Assistant:

FunctionCodeGenJitTimeData * FunctionCodeGenJitTimeData::AddCallApplyTargetInlinee(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        const ProfileId callApplyCallSiteId,
        FunctionInfo *const inlinee)
    {
        Assert(recycler != nullptr);
        FunctionBody * functionBody = GetFunctionBody();
        Assert(functionBody != nullptr);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());
        Assert(inlinee != nullptr);

        if (!callApplyTargetInlinees)
        {
            callApplyTargetInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData *), functionBody->GetProfiledCallApplyCallSiteCount());
        }

        // Polymorphic call/apply targets are not inlined.
        Assert(callApplyTargetInlinees[callApplyCallSiteId] == nullptr);

        FunctionCodeGenJitTimeData * inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, true /*isInlined*/);
        callApplyTargetInlinees[callApplyCallSiteId] = inlineeData;
        return inlineeData;
    }